

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O0

int bstrListDestroy(bstrList *sl)

{
  int local_1c;
  int i;
  bstrList *sl_local;
  
  if ((sl == (bstrList *)0x0) || (sl->qty < 0)) {
    sl_local._4_4_ = -1;
  }
  else {
    for (local_1c = 0; local_1c < sl->qty; local_1c = local_1c + 1) {
      if (sl->entry[local_1c] != (bstring)0x0) {
        bdestroy(sl->entry[local_1c]);
        sl->entry[local_1c] = (bstring)0x0;
      }
    }
    sl->qty = -1;
    sl->mlen = -1;
    free(sl->entry);
    sl->entry = (bstring *)0x0;
    free(sl);
    sl_local._4_4_ = 0;
  }
  return sl_local._4_4_;
}

Assistant:

int bstrListDestroy (struct bstrList * sl) {
int i;
	if (sl == NULL || sl->qty < 0) return BSTR_ERR;
	for (i=0; i < sl->qty; i++) {
		if (sl->entry[i]) {
			bdestroy (sl->entry[i]);
			sl->entry[i] = NULL;
		}
	}
	sl->qty  = -1;
	sl->mlen = -1;
	bstr__free (sl->entry);
	sl->entry = NULL;
	bstr__free (sl);
	return BSTR_OK;
}